

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall
Renderer::Renderer(Renderer *this,size_t screen_width,size_t screen_height,size_t grid_width,
                  size_t grid_height)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  SDL_Window *pSVar4;
  SDL_Renderer *pSVar5;
  SDL_Surface *pSVar6;
  undefined8 uVar7;
  SDL_Texture *pSVar8;
  
  this->screen_width = screen_width;
  this->screen_height = screen_height;
  this->grid_width = grid_width;
  this->grid_height = grid_height;
  iVar1 = SDL_Init(0x20);
  if (iVar1 < 0) {
    std::operator<<((ostream *)&std::cerr,"SDL could not initialize.\n");
    poVar2 = std::operator<<((ostream *)&std::cerr,"SDL_Error: ");
    pcVar3 = (char *)SDL_GetError();
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\n");
  }
  pSVar4 = (SDL_Window *)
           SDL_CreateWindow("Duality Game",0x2fff0000,0x2fff0000,screen_width & 0xffffffff,
                            screen_height & 0xffffffff,4);
  this->sdl_window = pSVar4;
  if (pSVar4 == (SDL_Window *)0x0) {
    std::operator<<((ostream *)&std::cerr,"Window could not be created.\n");
    poVar2 = std::operator<<((ostream *)&std::cerr," SDL_Error: ");
    pcVar3 = (char *)SDL_GetError();
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\n");
    pSVar4 = this->sdl_window;
  }
  pSVar5 = (SDL_Renderer *)SDL_CreateRenderer(pSVar4,0xffffffffffffffff,2);
  this->sdl_renderer = pSVar5;
  if (pSVar5 == (SDL_Renderer *)0x0) {
    std::operator<<((ostream *)&std::cerr,"Hardware Renderer could not be created.\n");
    std::operator<<((ostream *)&std::cerr,"Using Software Renderer");
    pSVar5 = (SDL_Renderer *)SDL_CreateRenderer(this->sdl_window,0xffffffffffffffff,1);
    this->sdl_renderer = pSVar5;
    if (pSVar5 == (SDL_Renderer *)0x0) {
      std::operator<<((ostream *)&std::cerr,"Renderer could not be created.\n");
      poVar2 = std::operator<<((ostream *)&std::cerr,"SDL_Error: ");
      pcVar3 = (char *)SDL_GetError();
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2,"\n");
    }
  }
  pSVar6 = (SDL_Surface *)SDL_GetWindowSurface(this->sdl_window);
  this->winSurface = pSVar6;
  uVar7 = SDL_RWFromFile("./flag.bmp","rb");
  pSVar6 = (SDL_Surface *)SDL_LoadBMP_RW(uVar7,1);
  this->endbmp = pSVar6;
  pSVar8 = (SDL_Texture *)SDL_CreateTextureFromSurface(this->sdl_renderer,pSVar6);
  this->tex = pSVar8;
  uVar7 = SDL_RWFromFile("./plane.bmp","rb");
  pSVar6 = (SDL_Surface *)SDL_LoadBMP_RW(uVar7,1);
  this->carBmp = pSVar6;
  pSVar8 = (SDL_Texture *)SDL_CreateTextureFromSurface(this->sdl_renderer,pSVar6);
  this->texCar = pSVar8;
  return;
}

Assistant:

Renderer::Renderer(const std::size_t screen_width,
                   const std::size_t screen_height,
                   const std::size_t grid_width, const std::size_t grid_height)
    : screen_width(screen_width),
      screen_height(screen_height),
      grid_width(grid_width),
      grid_height(grid_height) {
  // Initialize SDL
  if (SDL_Init(SDL_INIT_VIDEO) < 0) {
    std::cerr << "SDL could not initialize.\n";
    std::cerr << "SDL_Error: " << SDL_GetError() << "\n";


  }

  // Create Window
  sdl_window = SDL_CreateWindow("Duality Game", SDL_WINDOWPOS_CENTERED,
                                SDL_WINDOWPOS_CENTERED, screen_width,
                                screen_height, SDL_WINDOW_SHOWN);

  if (nullptr == sdl_window) {
    std::cerr << "Window could not be created.\n";
    std::cerr << " SDL_Error: " << SDL_GetError() << "\n";
  }

  // Create renderer
   sdl_renderer = SDL_CreateRenderer(sdl_window, -1, SDL_RENDERER_ACCELERATED);
  if (nullptr == sdl_renderer) {
    std::cerr << "Hardware Renderer could not be created.\n";
    //std::cerr << "SDL_Error: " << SDL_GetError() << "\n";
    std::cerr << "Using Software Renderer";
    sdl_renderer = SDL_CreateRenderer(sdl_window, -1, SDL_RENDERER_SOFTWARE);
    if (nullptr == sdl_renderer){
       std::cerr << "Renderer could not be created.\n";
       std::cerr << "SDL_Error: " << SDL_GetError() << "\n";
    }
  }

  // creaete the textures that will holdl the images
  winSurface = SDL_GetWindowSurface(sdl_window);
  endbmp = SDL_LoadBMP("./flag.bmp");
  tex = SDL_CreateTextureFromSurface(sdl_renderer,endbmp);
  carBmp = SDL_LoadBMP("./plane.bmp");
  texCar = SDL_CreateTextureFromSurface(sdl_renderer,carBmp);
}